

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O3

void __thiscall CCIT<UFPC>::FirstScan(CCIT<UFPC> *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  Mat1i *pMVar7;
  Mat1b *pMVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  bool bVar41;
  ulong local_90;
  long local_70;
  long local_68;
  long local_60;
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar15 = 0;
  memset(*(void **)&pMVar7->field_0x10,0,*(long *)&pMVar7->field_0x20 - *(long *)&pMVar7->field_0x18
        );
  puVar13 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar5 = *(int *)&pMVar7->field_0xc;
  lVar37 = (long)iVar5;
  uVar6 = *(uint *)&pMVar7->field_0x8;
  uVar23 = (ulong)uVar6;
  if (0 < lVar37) {
    pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar9 = *(long *)&pMVar8->field_0x10;
    lVar26 = **(long **)&pMVar8->field_0x48 + lVar9;
    lVar10 = *(long *)&pMVar7->field_0x10;
    do {
      uVar27 = UFPC::length_;
      lVar30 = (long)iVar15;
      if (*(char *)(lVar9 + lVar30) == '\0') {
        lVar11 = lVar30 + 1;
        iVar35 = (int)lVar11;
        if ((iVar35 < iVar5) && (*(char *)(lVar9 + lVar11) != '\0')) {
LAB_001d64b2:
          puVar13[UFPC::length_] = UFPC::length_;
          uVar38 = UFPC::length_ + 1;
          *(uint *)(lVar10 + lVar30 * 4) = UFPC::length_;
          UFPC::length_ = uVar38;
          goto LAB_001d64ca;
        }
        if (1 < (int)uVar6) {
          if (*(char *)(lVar26 + lVar30) == '\0') {
            if ((iVar35 < iVar5) && (*(char *)(lVar26 + lVar11) != '\0')) goto LAB_001d64b2;
          }
          else {
            puVar13[UFPC::length_] = UFPC::length_;
            uVar38 = UFPC::length_ + 1;
            *(uint *)(lVar10 + lVar30 * 4) = UFPC::length_;
            UFPC::length_ = uVar38;
            if (iVar35 < iVar5) {
              cVar4 = *(char *)(lVar26 + lVar11);
              goto joined_r0x001d65ae;
            }
          }
        }
LAB_001d65cc:
        uVar31 = (ulong)(iVar15 + 2);
      }
      else {
        puVar13[UFPC::length_] = UFPC::length_;
        uVar38 = UFPC::length_ + 1;
        *(uint *)(lVar10 + lVar30 * 4) = UFPC::length_;
        UFPC::length_ = uVar38;
        lVar30 = lVar30 + 1;
        if (iVar5 <= (int)lVar30) goto LAB_001d65cc;
        if (*(char *)(lVar9 + lVar30) == '\0') {
          if (1 < (int)uVar6) {
            cVar4 = *(char *)(lVar26 + lVar30);
joined_r0x001d65ae:
            if (cVar4 != '\0') goto LAB_001d64ca;
          }
          goto LAB_001d65cc;
        }
LAB_001d64ca:
        uVar29 = (ulong)uVar27;
        uVar27 = iVar15 + 2;
        uVar31 = (ulong)uVar27;
        if ((int)uVar27 < iVar5) {
          uVar31 = (ulong)(int)uVar27;
          iVar15 = iVar15 + 3;
          do {
            if (*(char *)(lVar9 + uVar31) == '\0') {
              if ((iVar15 < iVar5) && (*(char *)(lVar9 + iVar15) != '\0')) {
                if (((int)uVar6 < 2) || (*(char *)(lVar26 + uVar31) == '\0')) {
LAB_001d655b:
                  uVar29 = (ulong)UFPC::length_;
                  puVar13[uVar29] = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                }
                *(int *)(lVar10 + uVar31 * 4) = (int)uVar29;
                goto LAB_001d6573;
              }
              if (1 < (int)uVar6) {
                if (*(char *)(lVar26 + uVar31) == '\0') {
                  if ((iVar15 < iVar5) && (*(char *)(lVar26 + iVar15) != '\0')) goto LAB_001d655b;
                }
                else {
                  *(int *)(lVar10 + uVar31 * 4) = (int)uVar29;
                  if (iVar15 < iVar5) goto LAB_001d6544;
                }
              }
LAB_001d65b6:
              uVar31 = uVar31 + 2;
              break;
            }
            *(int *)(lVar10 + uVar31 * 4) = (int)uVar29;
            if (iVar5 <= iVar15) goto LAB_001d65b6;
            if (*(char *)(lVar9 + iVar15) == '\0') {
              if (1 < (int)uVar6) {
LAB_001d6544:
                if (*(char *)(lVar26 + iVar15) != '\0') goto LAB_001d6573;
              }
              goto LAB_001d65b6;
            }
LAB_001d6573:
            uVar31 = uVar31 + 2;
            iVar15 = iVar15 + 2;
          } while ((long)uVar31 < lVar37);
        }
      }
      iVar15 = (int)uVar31;
    } while (iVar15 < iVar5);
  }
  if (2 < (int)uVar6) {
    local_90 = 2;
    local_60 = 1;
    local_68 = 3;
    local_70 = 0;
    do {
      if (0 < iVar5) {
        pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar26 = *(long *)&pMVar8->field_0x10;
        lVar30 = **(long **)&pMVar8->field_0x48;
        lVar24 = lVar30 * local_90 + lVar26;
        lVar36 = lVar24 - lVar30;
        lVar25 = lVar24 + lVar30;
        lVar11 = *(long *)&pMVar7->field_0x10;
        lVar12 = **(long **)&pMVar7->field_0x48;
        lVar32 = lVar12 * local_90 + lVar11;
        lVar33 = lVar32 + lVar12 * -2;
        lVar9 = lVar36 + -1;
        lVar34 = lVar33 + -8;
        uVar29 = local_90 | 1;
        lVar10 = lVar36 + 1;
        uVar31 = 0;
        do {
          iVar35 = (int)uVar31;
          uVar18 = (ulong)iVar35;
          uVar1 = uVar18 + 1;
          iVar15 = (int)uVar1;
          if (*(char *)(lVar24 + uVar18) == '\0') {
            if ((iVar15 < iVar5) && (*(char *)(lVar24 + uVar1) != '\0')) {
              if (*(char *)(lVar36 + uVar1) == '\0') {
                if (*(char *)(lVar36 + uVar18) != '\0') {
                  uVar27 = *(uint *)(lVar33 + uVar18 * 4);
                  *(uint *)(lVar32 + uVar18 * 4) = uVar27;
                  goto LAB_001d6920;
                }
LAB_001d6945:
                if (((int)(uVar18 + 2) < iVar5) && (*(char *)(lVar36 + uVar18 + 2) != '\0')) {
                  uVar39 = (ulong)*(uint *)(lVar33 + 8 + uVar18 * 4);
                }
                else {
LAB_001d6960:
                  uVar39 = (ulong)UFPC::length_;
                  UFPC::P_[uVar39] = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                }
              }
              else {
                uVar39 = (ulong)*(uint *)(lVar33 + uVar18 * 4);
              }
              *(int *)(lVar32 + uVar18 * 4) = (int)uVar39;
              bVar41 = true;
              goto LAB_001d698a;
            }
            if (uVar29 < uVar23) {
              if (*(char *)(lVar25 + uVar18) == '\0') {
                if ((iVar15 < iVar5) && (*(char *)(lVar25 + uVar1) != '\0')) goto LAB_001d6960;
              }
              else {
                uVar39 = (ulong)UFPC::length_;
                UFPC::P_[uVar39] = UFPC::length_;
                uVar27 = UFPC::length_ + 1;
                *(uint *)(lVar32 + uVar18 * 4) = UFPC::length_;
                UFPC::length_ = uVar27;
                if ((iVar15 < iVar5) && (bVar41 = true, *(char *)(lVar25 + uVar1) != '\0'))
                goto LAB_001d698a;
              }
            }
LAB_001d68d4:
            uVar27 = iVar35 + 2;
          }
          else {
            if ((iVar15 < iVar5) && (*(char *)(lVar24 + uVar1) != '\0')) {
              if (*(char *)(lVar36 + uVar18) == '\0') {
                if (*(char *)(lVar36 + uVar1) == '\0') {
                  if ((iVar35 < 2) || (*(char *)(lVar9 + uVar18) == '\0')) goto LAB_001d6945;
                  uVar27 = *(uint *)(lVar34 + uVar18 * 4);
                  *(uint *)(lVar32 + uVar18 * 4) = uVar27;
                  uVar18 = uVar31;
LAB_001d6920:
                  uVar39 = (ulong)uVar27;
                  goto LAB_001d6927;
                }
                uVar27 = *(uint *)(lVar33 + uVar18 * 4);
                uVar39 = (ulong)uVar27;
                *(uint *)(lVar32 + uVar18 * 4) = uVar27;
                bVar41 = true;
                if ((iVar35 < 2) || (*(char *)(lVar9 + uVar18) == '\0')) goto LAB_001d698a;
                uVar27 = *(uint *)(lVar34 + uVar18 * 4);
LAB_001d693b:
                bVar41 = true;
                UFPC::Merge((uint)uVar39,uVar27);
              }
              else {
                uVar27 = *(uint *)(lVar33 + uVar18 * 4);
                uVar39 = (ulong)uVar27;
                *(uint *)(lVar32 + uVar18 * 4) = uVar27;
                bVar41 = true;
                if (*(char *)(lVar36 + uVar1) == '\0') {
LAB_001d6927:
                  bVar41 = true;
                  if (((int)(uVar18 + 2) < iVar5) && (*(char *)(lVar36 + uVar18 + 2) != '\0')) {
                    uVar27 = *(uint *)(lVar33 + 8 + uVar18 * 4);
                    goto LAB_001d693b;
                  }
                }
              }
            }
            else {
              if (*(char *)(lVar36 + uVar18) == '\0') {
                if ((iVar35 < 2) || (*(char *)(lVar9 + uVar18) == '\0')) {
                  if ((iVar15 < iVar5) && (*(char *)(lVar36 + uVar1) != '\0')) goto LAB_001d6747;
                  uVar39 = (ulong)UFPC::length_;
                  UFPC::P_[uVar39] = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  goto LAB_001d6856;
                }
                uVar27 = *(uint *)(lVar34 + uVar18 * 4);
                uVar39 = (ulong)uVar27;
                *(uint *)(lVar32 + uVar18 * 4) = uVar27;
                if (iVar5 <= iVar15) goto LAB_001d68d4;
                if (*(char *)(lVar36 + (uVar1 & 0xffffffff)) != '\0') {
                  UFPC::Merge(uVar27,*(uint *)(lVar33 + uVar18 * 4));
                }
              }
              else {
LAB_001d6747:
                uVar39 = (ulong)*(uint *)(lVar33 + uVar18 * 4);
LAB_001d6856:
                *(int *)(lVar32 + uVar18 * 4) = (int)uVar39;
              }
              if ((iVar5 <= iVar15) || (uVar23 <= uVar29)) goto LAB_001d68d4;
              bVar41 = *(char *)(lVar25 + uVar1) != '\0';
            }
LAB_001d698a:
            uVar27 = iVar35 + 2;
            if ((bVar41) && ((int)uVar27 < iVar5)) {
              lVar28 = (long)(int)uVar27;
              lVar2 = lVar32 + lVar28 * 4;
              lVar19 = lVar30 * local_60 + lVar26 + lVar28;
              lVar3 = lVar12 * local_70 + lVar11 + lVar28 * 4;
              lVar20 = lVar30 * local_68 + lVar26 + lVar28;
              lVar40 = 0;
              do {
                uVar1 = uVar31 + 3 + lVar40;
                uVar38 = (uint)uVar39;
                iVar17 = (int)uVar1;
                iVar15 = (int)lVar40;
                if (*(char *)(lVar24 + lVar28 + lVar40) == '\0') {
                  if ((iVar5 <= iVar17) ||
                     (lVar21 = (long)iVar17, *(char *)(lVar24 + lVar21) == '\0')) {
                    if (uVar29 < uVar23) {
                      if (*(char *)(lVar20 + lVar40) != '\0') {
                        *(uint *)(lVar2 + lVar40 * 4) = uVar38;
                        if (iVar5 <= iVar17) goto LAB_001d6dba;
                        goto LAB_001d6b62;
                      }
                      if ((iVar17 < iVar5) && (*(char *)(lVar25 + iVar17) != '\0')) {
LAB_001d6bfb:
                        uVar39 = (ulong)UFPC::length_;
                        UFPC::P_[uVar39] = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                        goto LAB_001d6c33;
                      }
                    }
                    goto LAB_001d6dba;
                  }
                  if ((uVar29 < uVar23) && (*(char *)(lVar20 + lVar40) != '\0')) {
                    *(uint *)(lVar2 + lVar40 * 4) = uVar38;
                    if (*(char *)(lVar36 + lVar21) == '\0') {
                      if (*(char *)(lVar19 + lVar40) != '\0') {
                        iVar17 = iVar35 + iVar15 + 4;
                        if ((iVar5 <= iVar17) || (*(char *)(lVar36 + iVar17) == '\0'))
                        goto LAB_001d6b17;
                        uVar16 = UFPC::Merge(*(uint *)(lVar3 + lVar40 * 4),
                                             *(uint *)(lVar33 + (long)iVar17 * 4));
                        goto LAB_001d6b20;
                      }
                    }
                    else {
LAB_001d6b17:
                      uVar16 = *(uint *)(lVar3 + lVar40 * 4);
LAB_001d6b20:
                      UFPC::Merge(uVar38,uVar16);
                    }
LAB_001d6d5d:
                    iVar15 = iVar35 + iVar15 + 4;
                    if ((iVar15 < iVar5) &&
                       (uVar18 = (ulong)iVar15, *(char *)(lVar36 + uVar18) != '\0'))
                    goto LAB_001d6d7f;
                  }
                  else {
                    if (*(char *)(lVar36 + lVar21) == '\0') {
                      if (*(char *)(lVar19 + lVar40) != '\0') {
                        uVar38 = *(uint *)(lVar3 + lVar40 * 4);
                        uVar39 = (ulong)uVar38;
                        *(uint *)(lVar2 + lVar40 * 4) = uVar38;
                        goto LAB_001d6d5d;
                      }
                      iVar15 = iVar35 + iVar15 + 4;
                      if ((iVar5 <= iVar15) || (*(char *)(lVar36 + iVar15) == '\0'))
                      goto LAB_001d6bfb;
                      uVar39 = (ulong)*(uint *)(lVar33 + (long)iVar15 * 4);
                    }
                    else {
                      uVar39 = (ulong)*(uint *)(lVar3 + lVar40 * 4);
                    }
LAB_001d6c33:
                    *(int *)(lVar2 + lVar40 * 4) = (int)uVar39;
                  }
                }
                else {
                  uVar18 = uVar31 + lVar40;
                  *(uint *)(lVar2 + lVar40 * 4) = uVar38;
                  iVar14 = (int)uVar18;
                  if ((iVar5 <= iVar17) || (*(char *)(lVar24 + iVar17) == '\0')) {
                    if (*(char *)(lVar19 + lVar40) == '\0') {
                      if ((-1 < iVar14) &&
                         (uVar18 = uVar18 & 0xffffffff, *(char *)(lVar10 + uVar18) != '\0')) {
                        if ((iVar17 < iVar5) && (*(char *)(lVar36 + (uVar1 & 0xffffffff)) != '\0'))
                        {
                          uVar16 = UFPC::Merge(*(uint *)(lVar33 + uVar18 * 4),
                                               *(uint *)(lVar3 + lVar40 * 4));
                        }
                        else {
                          uVar16 = *(uint *)(lVar33 + uVar18 * 4);
                        }
                        goto LAB_001d6aa3;
                      }
                      if (iVar5 <= iVar17) goto LAB_001d6dba;
                      if (*(char *)(lVar36 + iVar17) != '\0') goto LAB_001d6a9a;
                    }
                    else {
LAB_001d6a9a:
                      uVar16 = *(uint *)(lVar3 + lVar40 * 4);
LAB_001d6aa3:
                      UFPC::Merge(uVar38,uVar16);
                    }
                    if ((iVar17 < iVar5) && (uVar29 < uVar23)) {
LAB_001d6b62:
                      if (*(char *)(lVar25 + iVar17) != '\0') goto LAB_001d6c84;
                    }
LAB_001d6dba:
                    uVar27 = uVar27 + iVar15 + 2;
                    goto LAB_001d6dcb;
                  }
                  cVar4 = *(char *)(lVar36 + iVar17);
                  if (*(char *)(lVar19 + lVar40) == '\0') {
                    if (cVar4 != '\0') {
                      if ((iVar14 < 0) || (*(char *)(lVar10 + (uVar18 & 0xffffffff)) == '\0'))
                      goto LAB_001d6c73;
                      uVar16 = *(uint *)(lVar33 + (uVar18 & 0xffffffff) * 4);
                      uVar22 = *(uint *)(lVar3 + lVar40 * 4);
                      goto LAB_001d6c67;
                    }
                    if ((iVar14 < 0) ||
                       (uVar18 = uVar18 & 0xffffffff, *(char *)(lVar10 + uVar18) == '\0'))
                    goto LAB_001d6d5d;
                    uVar22 = iVar35 + iVar15 + 4;
                    if (((int)uVar22 < iVar5) && (*(char *)(lVar36 + (ulong)uVar22) != '\0')) {
                      uVar16 = *(uint *)(lVar33 + uVar18 * 4);
                      uVar22 = *(uint *)(lVar33 + (ulong)uVar22 * 4);
                      goto LAB_001d6c67;
                    }
LAB_001d6d7f:
                    uVar16 = *(uint *)(lVar33 + uVar18 * 4);
LAB_001d6c7c:
                    uVar38 = (uint)uVar39;
                  }
                  else {
                    if (((cVar4 != '\0') || (iVar15 = iVar35 + iVar15 + 4, iVar5 <= iVar15)) ||
                       (*(char *)(lVar36 + iVar15) == '\0')) {
LAB_001d6c73:
                      uVar16 = *(uint *)(lVar3 + lVar40 * 4);
                      goto LAB_001d6c7c;
                    }
                    uVar16 = *(uint *)(lVar3 + lVar40 * 4);
                    uVar22 = *(uint *)(lVar33 + (long)iVar15 * 4);
LAB_001d6c67:
                    uVar16 = UFPC::Merge(uVar16,uVar22);
                  }
                  UFPC::Merge(uVar38,uVar16);
                }
LAB_001d6c84:
                lVar21 = lVar28 + lVar40;
                lVar40 = lVar40 + 2;
              } while (lVar21 + 2 < lVar37);
              uVar27 = uVar27 + (int)lVar40;
            }
          }
LAB_001d6dcb:
          uVar31 = (ulong)uVar27;
        } while ((int)uVar27 < iVar5);
      }
      local_90 = local_90 + 2;
      local_60 = local_60 + 2;
      local_70 = local_70 + 2;
      local_68 = local_68 + 2;
    } while ((int)local_90 < (int)uVar6);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w = img_labels_.cols;
        int h = img_labels_.rows;

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }